

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

void compact_monsters(chunk *c,wchar_t num_to_compact)

{
  monster_race *race;
  loc grid;
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  wchar_t wVar4;
  monster *pmVar5;
  int iVar6;
  uint uVar7;
  wchar_t local_38;
  
  if (num_to_compact != L'\0') {
    local_38 = L'\0';
    msg("Compacting monsters...");
    if (L'\0' < num_to_compact) {
      uVar7 = 1;
      do {
        wVar2 = cave_monster_max((chunk_conflict *)c);
        if (L'\x01' < wVar2) {
          wVar2 = L'\x01';
          do {
            pmVar5 = cave_monster((chunk_conflict *)c,wVar2);
            race = pmVar5->race;
            if (((race != (monster_race *)0x0) &&
                (wVar4 = race->level,
                wVar4 == uVar7 * 5 || SBORROW4(wVar4,uVar7 * 5) != wVar4 + uVar7 * -5 < 0)) &&
               ((0x13 < uVar7 || ((int)((0x14 - uVar7) * 5) <= (int)(uint)pmVar5->cdis)))) {
              _Var1 = quest_unique_monster_check(race);
              iVar6 = 0x5a;
              if (uVar7 < 1000) {
                iVar6 = 100;
              }
              if (!_Var1) {
                iVar6 = 0x5a;
              }
              _Var1 = monster_is_unique(pmVar5);
              if (_Var1) {
                iVar6 = 99;
              }
              uVar3 = Rand_div(100);
              if (iVar6 <= (int)uVar3) {
                grid.x = (pmVar5->grid).x;
                grid.y = (pmVar5->grid).y;
                delete_monster(c,grid);
                local_38 = local_38 + L'\x01';
              }
            }
            wVar2 = wVar2 + L'\x01';
            wVar4 = cave_monster_max((chunk_conflict *)c);
          } while (wVar2 < wVar4);
        }
        uVar7 = uVar7 + 1;
      } while (local_38 < num_to_compact);
    }
  }
  wVar2 = cave_monster_max((chunk_conflict *)c);
  if (L'\x01' < wVar2) {
    uVar7 = wVar2 + L'\x01';
    do {
      pmVar5 = cave_monster((chunk_conflict *)c,uVar7 + L'\xfffffffe');
      if (pmVar5->race == (monster_race *)0x0) {
        wVar2 = cave_monster_max((chunk_conflict *)c);
        monster_index_move(c,wVar2 + L'\xffffffff',uVar7 + L'\xfffffffe');
        c->mon_max = c->mon_max - 1;
      }
      uVar7 = uVar7 - 1;
    } while (2 < uVar7);
  }
  return;
}

Assistant:

void compact_monsters(struct chunk *c, int num_to_compact)
{
	int m_idx, num_compacted, iter;

	int max_lev, min_dis, chance;


	/* Message (only if compacting) */
	if (num_to_compact)
		msg("Compacting monsters...");


	/* Compact at least 'num_to_compact' objects */
	for (num_compacted = 0, iter = 1; num_compacted < num_to_compact; iter++) {
		/* Get more vicious each iteration */
		max_lev = 5 * iter;

		/* Get closer each iteration */
		min_dis = 5 * (20 - iter);

		/* Check all the monsters */
		for (m_idx = 1; m_idx < cave_monster_max(c); m_idx++) {
			struct monster *mon = cave_monster(c, m_idx);

			/* Skip "dead" monsters */
			if (!mon->race) continue;

			/* High level monsters start out "immune" */
			if (mon->race->level > max_lev) continue;

			/* Ignore nearby monsters */
			if ((min_dis > 0) && (mon->cdis < min_dis)) continue;

			/* Saving throw chance */
			chance = 90;

			/* Only compact "Quest" Monsters in emergencies */
			if (quest_unique_monster_check(mon->race) && (iter < 1000))
				chance = 100;

			/* Try not to compact Unique Monsters */
			if (monster_is_unique(mon)) chance = 99;

			/* All monsters get a saving throw */
			if (randint0(100) < chance) continue;

			/* Delete the monster */
			delete_monster(c, mon->grid);

			/* Count the monster */
			num_compacted++;
		}
	}


	/* Excise dead monsters (backwards!) */
	for (m_idx = cave_monster_max(c) - 1; m_idx >= 1; m_idx--) {
		struct monster *mon = cave_monster(c, m_idx);

		/* Skip real monsters */
		if (mon->race) continue;

		/* Move last monster into open hole */
		monster_index_move(c, cave_monster_max(c) - 1, m_idx);

		/* Compress "c->mon_max" */
		c->mon_max--;
	}
}